

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_rules.hpp
# Opt level: O2

void ovf::detail::parse::v2::ovf_segment_header_action<ovf::detail::parse::v2::segment_header>::
     apply<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
               (action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *in,ovf_file *file,ovf_segment *segment)

{
  bool bVar1;
  parser_state *ppVar2;
  parse_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  long lVar3;
  ulong uVar4;
  string message;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missing_keywords;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&missing_keywords,0,(allocator_type *)&message);
  ppVar2 = file->_state;
  if (ppVar2->found_title == false) {
    std::__cxx11::string::string((string *)&message,"title",(allocator *)&local_50);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &missing_keywords,&message);
    std::__cxx11::string::~string((string *)&message);
    ppVar2 = file->_state;
  }
  if (ppVar2->found_meshunit == false) {
    std::__cxx11::string::string((string *)&message,"meshunit",(allocator *)&local_50);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &missing_keywords,&message);
    std::__cxx11::string::~string((string *)&message);
    ppVar2 = file->_state;
  }
  if (ppVar2->found_valueunits == false) {
    std::__cxx11::string::string((string *)&message,"valueunits",(allocator *)&local_50);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &missing_keywords,&message);
    std::__cxx11::string::~string((string *)&message);
    ppVar2 = file->_state;
  }
  if (ppVar2->found_valuelabels == false) {
    std::__cxx11::string::string((string *)&message,"valuelabels",(allocator *)&local_50);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &missing_keywords,&message);
    std::__cxx11::string::~string((string *)&message);
    ppVar2 = file->_state;
  }
  if (ppVar2->found_xmin == false) {
    std::__cxx11::string::string((string *)&message,"xmin",(allocator *)&local_50);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &missing_keywords,&message);
    std::__cxx11::string::~string((string *)&message);
    ppVar2 = file->_state;
  }
  if (ppVar2->found_ymin == false) {
    std::__cxx11::string::string((string *)&message,"ymin",(allocator *)&local_50);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &missing_keywords,&message);
    std::__cxx11::string::~string((string *)&message);
    ppVar2 = file->_state;
  }
  if (ppVar2->found_zmin == false) {
    std::__cxx11::string::string((string *)&message,"zmin",(allocator *)&local_50);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &missing_keywords,&message);
    std::__cxx11::string::~string((string *)&message);
    ppVar2 = file->_state;
  }
  if (ppVar2->found_xmax == false) {
    std::__cxx11::string::string((string *)&message,"xmax",(allocator *)&local_50);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &missing_keywords,&message);
    std::__cxx11::string::~string((string *)&message);
    ppVar2 = file->_state;
  }
  if (ppVar2->found_ymax == false) {
    std::__cxx11::string::string((string *)&message,"ymax",(allocator *)&local_50);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &missing_keywords,&message);
    std::__cxx11::string::~string((string *)&message);
    ppVar2 = file->_state;
  }
  if (ppVar2->found_zmax == false) {
    std::__cxx11::string::string((string *)&message,"zmax",(allocator *)&local_50);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &missing_keywords,&message);
    std::__cxx11::string::~string((string *)&message);
    ppVar2 = file->_state;
  }
  if (ppVar2->found_meshtype == false) {
    std::__cxx11::string::string((string *)&message,"meshtype",(allocator *)&local_50);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &missing_keywords,&message);
    std::__cxx11::string::~string((string *)&message);
  }
  std::__cxx11::string::string((string *)&message,segment->meshtype,(allocator *)&local_50);
  bVar1 = std::operator==(&message,"rectangular");
  std::__cxx11::string::~string((string *)&message);
  if (bVar1) {
    segment->N = segment->n_cells[1] * segment->n_cells[0] * segment->n_cells[2];
    ppVar2 = file->_state;
    if (ppVar2->found_xbase == false) {
      std::__cxx11::string::string((string *)&message,"xbase",(allocator *)&local_50);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &missing_keywords,&message);
      std::__cxx11::string::~string((string *)&message);
      ppVar2 = file->_state;
    }
    if (ppVar2->found_ybase == false) {
      std::__cxx11::string::string((string *)&message,"ybase",(allocator *)&local_50);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &missing_keywords,&message);
      std::__cxx11::string::~string((string *)&message);
      ppVar2 = file->_state;
    }
    if (ppVar2->found_zbase == false) {
      std::__cxx11::string::string((string *)&message,"zbase",(allocator *)&local_50);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &missing_keywords,&message);
      std::__cxx11::string::~string((string *)&message);
      ppVar2 = file->_state;
    }
    if (ppVar2->found_xstepsize == false) {
      std::__cxx11::string::string((string *)&message,"xstepsize",(allocator *)&local_50);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &missing_keywords,&message);
      std::__cxx11::string::~string((string *)&message);
      ppVar2 = file->_state;
    }
    if (ppVar2->found_ystepsize == false) {
      std::__cxx11::string::string((string *)&message,"ystepsize",(allocator *)&local_50);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &missing_keywords,&message);
      std::__cxx11::string::~string((string *)&message);
      ppVar2 = file->_state;
    }
    if (ppVar2->found_zstepsize == false) {
      std::__cxx11::string::string((string *)&message,"zstepsize",(allocator *)&local_50);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &missing_keywords,&message);
      std::__cxx11::string::~string((string *)&message);
      ppVar2 = file->_state;
    }
    if (ppVar2->found_xnodes == false) {
      std::__cxx11::string::string((string *)&message,"xnodes",(allocator *)&local_50);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &missing_keywords,&message);
      std::__cxx11::string::~string((string *)&message);
      ppVar2 = file->_state;
    }
    if (ppVar2->found_ynodes == false) {
      std::__cxx11::string::string((string *)&message,"ynodes",(allocator *)&local_50);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &missing_keywords,&message);
      std::__cxx11::string::~string((string *)&message);
      ppVar2 = file->_state;
    }
    if (ppVar2->found_znodes != false) goto LAB_0013d807;
    std::__cxx11::string::string((string *)&message,"znodes",(allocator *)&local_50);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &missing_keywords,&message);
  }
  else {
    std::__cxx11::string::string((string *)&message,segment->meshtype,(allocator *)&local_50);
    bVar1 = std::operator==(&message,"irregular");
    std::__cxx11::string::~string((string *)&message);
    if ((!bVar1) || (segment->N = segment->pointcount, file->_state->found_pointcount != false))
    goto LAB_0013d807;
    std::__cxx11::string::string((string *)&message,"pointcount",(allocator *)&local_50);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &missing_keywords,&message);
  }
  std::__cxx11::string::~string((string *)&message);
LAB_0013d807:
  if (missing_keywords.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      missing_keywords.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&missing_keywords);
    return;
  }
  fmt::v5::format<char[23],std::__cxx11::string>
            (&message,(v5 *)"Missing keywords: \"{}\"",
             (char (*) [23])
             missing_keywords.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,in_RCX);
  lVar3 = 0x20;
  for (uVar4 = 1;
      uVar4 < (ulong)((long)missing_keywords.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)missing_keywords.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar4 = uVar4 + 1) {
    fmt::v5::format<char[7],std::__cxx11::string>
              (&local_50,(v5 *)", \"{}\"",
               (char (*) [7])
               ((long)&((missing_keywords.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar3),
               in_RCX);
    std::__cxx11::string::append((string *)&message);
    std::__cxx11::string::~string((string *)&local_50);
    lVar3 = lVar3 + 0x20;
  }
  this = (parse_error *)__cxa_allocate_exception(0x28);
  tao::pegtl::parse_error::
  parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
            (this,&message,in);
  __cxa_throw(this,&tao::pegtl::parse_error::typeinfo,tao::pegtl::parse_error::~parse_error);
}

Assistant:

static void apply( const Input& in, ovf_file & file, ovf_segment & segment )
            {
                // Check if all required keywords were present
                std::vector<std::string> missing_keywords(0);
                if( !file._state->found_title )
                    missing_keywords.push_back("title");
                if( !file._state->found_meshunit )
                    missing_keywords.push_back("meshunit");
                if( !file._state->found_valueunits )
                    missing_keywords.push_back("valueunits");
                if( !file._state->found_valuelabels )
                    missing_keywords.push_back("valuelabels");
                if( !file._state->found_xmin )
                    missing_keywords.push_back("xmin");
                if( !file._state->found_ymin )
                    missing_keywords.push_back("ymin");
                if( !file._state->found_zmin )
                    missing_keywords.push_back("zmin");
                if( !file._state->found_xmax )
                    missing_keywords.push_back("xmax");
                if( !file._state->found_ymax )
                    missing_keywords.push_back("ymax");
                if( !file._state->found_zmax )
                    missing_keywords.push_back("zmax");
                if( !file._state->found_meshtype )
                    missing_keywords.push_back("meshtype");

                if( std::string(segment.meshtype) == "rectangular" )
                {
                    segment.N = segment.n_cells[0] * segment.n_cells[1] * segment.n_cells[2];

                    if( !file._state->found_xbase )
                        missing_keywords.push_back("xbase");
                    if( !file._state->found_ybase )
                        missing_keywords.push_back("ybase");
                    if( !file._state->found_zbase )
                        missing_keywords.push_back("zbase");
                    if( !file._state->found_xstepsize )
                        missing_keywords.push_back("xstepsize");
                    if( !file._state->found_ystepsize )
                        missing_keywords.push_back("ystepsize");
                    if( !file._state->found_zstepsize )
                        missing_keywords.push_back("zstepsize");
                    if( !file._state->found_xnodes )
                        missing_keywords.push_back("xnodes");
                    if( !file._state->found_ynodes )
                        missing_keywords.push_back("ynodes");
                    if( !file._state->found_znodes )
                        missing_keywords.push_back("znodes");
                }
                else if( std::string(segment.meshtype) == "irregular" )
                {
                    segment.N = segment.pointcount;

                    if( !file._state->found_pointcount )
                        missing_keywords.push_back("pointcount");
                }

                if( missing_keywords.size() > 0 )
                {
                    std::string message = fmt::format( "Missing keywords: \"{}\"", missing_keywords[0] );
                    for( int i=1; i < missing_keywords.size(); ++i )
                        message += fmt::format( ", \"{}\"", missing_keywords[i] );
                    throw tao::pegtl::parse_error( message, in );
                }
            }